

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

cache_interface * __thiscall cppcms::http::context::cache(context *this)

{
  _data *p_Var1;
  cache_interface *pcVar2;
  
  p_Var1 = (this->d).ptr_;
  pcVar2 = (p_Var1->cache)._M_t.
           super___uniq_ptr_impl<cppcms::cache_interface,_std::default_delete<cppcms::cache_interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::cache_interface_*,_std::default_delete<cppcms::cache_interface>_>
           .super__Head_base<0UL,_cppcms::cache_interface_*,_false>._M_head_impl;
  if (pcVar2 == (cache_interface *)0x0) {
    pcVar2 = (cache_interface *)operator_new(0x80);
    cache_interface::cache_interface(pcVar2,this);
    std::__uniq_ptr_impl<cppcms::cache_interface,_std::default_delete<cppcms::cache_interface>_>::
    reset((__uniq_ptr_impl<cppcms::cache_interface,_std::default_delete<cppcms::cache_interface>_> *
          )&p_Var1->cache,pcVar2);
    pcVar2 = (((this->d).ptr_)->cache)._M_t.
             super___uniq_ptr_impl<cppcms::cache_interface,_std::default_delete<cppcms::cache_interface>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::cache_interface_*,_std::default_delete<cppcms::cache_interface>_>
             .super__Head_base<0UL,_cppcms::cache_interface_*,_false>._M_head_impl;
  }
  return pcVar2;
}

Assistant:

_data(context &cntx) :
			locale(cntx.connection().service().locale()),
			request(cntx.connection())
		{
		}